

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O1

void __thiscall test_b_tree::setup(test_b_tree *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __first;
  pointer __last;
  pointer puVar2;
  long lVar3;
  pointer puVar4;
  pointer plVar5;
  unsigned_long uVar6;
  default_random_engine rng;
  b_tree t;
  string local_80;
  b_tree local_60;
  
  paVar1 = &local_60._p._fileName.field_2;
  local_60._p._fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"test.db","");
  b_tree::create_db_file((string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._p._fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._p._fileName._M_dataplus._M_p,
                    local_60._p._fileName.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"test.db","");
  b_tree::b_tree(&local_60,&local_80,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  __last = test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  __first = test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    lVar3 = 0;
    plVar5 = test_keys.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *plVar5 = lVar3;
      lVar3 = lVar3 + 1;
      plVar5 = plVar5 + 1;
    } while (plVar5 != __last);
  }
  puVar2 = test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)__last - (long)__first >> 3;
    puVar4 = test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *puVar4 = uVar6;
      uVar6 = uVar6 + 1;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
  }
  local_80._M_dataplus._M_p = (pointer)0x1;
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__first,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__last,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_80);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )test_vals.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_80);
  insert_all<b_tree>(&local_60,&test_keys);
  pager::~pager(&local_60._p);
  return;
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}